

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walBeginShmUnreliable(Wal *pWal,int *pChanged)

{
  int iVar1;
  int iVar2;
  WalIndexHdr *__src;
  void *pvVar3;
  u32 *piPage;
  undefined4 *in_RSI;
  Wal *in_RDI;
  int i;
  u32 nTruncate;
  u32 pgno;
  u32 aSaveCksum [2];
  int rc;
  void *pDummy;
  u8 *aData;
  int szFrame;
  u8 *aFrame;
  u8 aBuf [32];
  i64 iOffset;
  i64 szWal;
  Wal *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  WalIndexHdr *id;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int iVar4;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  u32 uVar5;
  u32 uVar6;
  u32 *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  long local_38;
  long local_20;
  long local_18;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  iVar1 = walLockShared(in_stack_ffffffffffffff68,0);
  if (iVar1 == 0) {
    in_RDI->readLock = 0;
    iVar1 = sqlite3OsShmMap((sqlite3_file *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,iVar4,
                            &in_stack_ffffffffffffff68->pVfs);
    if (iVar1 == 0x508) {
      id = &in_RDI->hdr;
      __src = walIndexHdr(in_RDI);
      memcpy(id,__src,0x30);
      iVar1 = sqlite3OsFileSize((sqlite3_file *)id,(i64 *)in_stack_ffffffffffffff68);
      if (iVar1 == 0) {
        if (local_18 < 0x20) {
          *in_RSI = 1;
          iVar1 = -1;
          if ((in_RDI->hdr).mxFrame == 0) {
            iVar1 = 0;
          }
        }
        else {
          iVar1 = sqlite3OsRead((sqlite3_file *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ),(int)((ulong)id >> 0x20),
                                (i64)in_stack_ffffffffffffff68);
          if (iVar1 == 0) {
            if (*(long *)(in_RDI->hdr).aSalt == local_38) {
              iVar4 = (in_RDI->hdr).szPage + 0x18;
              pvVar3 = sqlite3_malloc64((sqlite3_uint64)in_stack_ffffffffffffff68);
              if (pvVar3 == (void *)0x0) {
                iVar1 = 7;
              }
              else {
                piPage = (u32 *)((long)pvVar3 + 0x18);
                uVar5 = (in_RDI->hdr).aFrameCksum[0];
                uVar6 = (in_RDI->hdr).aFrameCksum[1];
                local_20 = (ulong)(in_RDI->hdr).mxFrame * (long)(int)((in_RDI->hdr).szPage + 0x18) +
                           0x20;
                while( true ) {
                  if (((local_18 < local_20 + iVar4) ||
                      (iVar1 = sqlite3OsRead((sqlite3_file *)
                                             CONCAT44(in_stack_ffffffffffffff84,
                                                      in_stack_ffffffffffffff80),
                                             (void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                              in_stack_ffffffffffffff78),
                                             (int)((ulong)id >> 0x20),(i64)in_stack_ffffffffffffff68
                                            ), iVar1 != 0)) ||
                     (iVar2 = walDecodeFrame((Wal *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),piPage
                                             ,in_stack_ffffffffffffff98,(u8 *)(ulong)uVar6,
                                             (u8 *)CONCAT44(uVar5,in_stack_ffffffffffffff88)),
                     iVar2 == 0)) goto LAB_00149146;
                  if (in_stack_ffffffffffffff84 != 0) break;
                  local_20 = iVar4 + local_20;
                  in_stack_ffffffffffffff84 = 0;
                }
                iVar1 = -1;
LAB_00149146:
                (in_RDI->hdr).aFrameCksum[0] = uVar5;
                (in_RDI->hdr).aFrameCksum[1] = uVar6;
              }
            }
            else {
              iVar1 = -1;
            }
          }
        }
      }
    }
    else if (iVar1 == 8) {
      iVar1 = -1;
    }
  }
  else if (iVar1 == 5) {
    iVar1 = -1;
  }
  sqlite3_free((void *)0x14916e);
  if (iVar1 != 0) {
    for (iVar4 = 0; iVar4 < in_RDI->nWiData; iVar4 = iVar4 + 1) {
      sqlite3_free((void *)0x1491ac);
      in_RDI->apWiData[iVar4] = (u32 *)0x0;
    }
    in_RDI->bShmUnreliable = '\0';
    sqlite3WalEndReadTransaction((Wal *)0x1491eb);
    *in_RSI = 1;
  }
  return iVar1;
}

Assistant:

static int walBeginShmUnreliable(Wal *pWal, int *pChanged){
  i64 szWal;                      /* Size of wal file on disk in bytes */
  i64 iOffset;                    /* Current offset when reading wal file */
  u8 aBuf[WAL_HDRSIZE];           /* Buffer to load WAL header into */
  u8 *aFrame = 0;                 /* Malloc'd buffer to load entire frame */
  int szFrame;                    /* Number of bytes in buffer aFrame[] */
  u8 *aData;                      /* Pointer to data part of aFrame buffer */
  volatile void *pDummy;          /* Dummy argument for xShmMap */
  int rc;                         /* Return code */
  u32 aSaveCksum[2];              /* Saved copy of pWal->hdr.aFrameCksum */

  assert( pWal->bShmUnreliable );
  assert( pWal->readOnly & WAL_SHM_RDONLY );
  assert( pWal->nWiData>0 && pWal->apWiData[0] );

  /* Take WAL_READ_LOCK(0). This has the effect of preventing any
  ** writers from running a checkpoint, but does not stop them
  ** from running recovery.  */
  rc = walLockShared(pWal, WAL_READ_LOCK(0));
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_BUSY ) rc = WAL_RETRY;
    goto begin_unreliable_shm_out;
  }
  pWal->readLock = 0;

  /* Check to see if a separate writer has attached to the shared-memory area,
  ** thus making the shared-memory "reliable" again.  Do this by invoking
  ** the xShmMap() routine of the VFS and looking to see if the return
  ** is SQLITE_READONLY instead of SQLITE_READONLY_CANTINIT.
  **
  ** If the shared-memory is now "reliable" return WAL_RETRY, which will
  ** cause the heap-memory WAL-index to be discarded and the actual
  ** shared memory to be used in its place.
  **
  ** This step is important because, even though this connection is holding
  ** the WAL_READ_LOCK(0) which prevents a checkpoint, a writer might
  ** have already checkpointed the WAL file and, while the current
  ** is active, wrap the WAL and start overwriting frames that this
  ** process wants to use.
  **
  ** Once sqlite3OsShmMap() has been called for an sqlite3_file and has
  ** returned any SQLITE_READONLY value, it must return only SQLITE_READONLY
  ** or SQLITE_READONLY_CANTINIT or some error for all subsequent invocations,
  ** even if some external agent does a "chmod" to make the shared-memory
  ** writable by us, until sqlite3OsShmUnmap() has been called.
  ** This is a requirement on the VFS implementation.
   */
  rc = sqlite3OsShmMap(pWal->pDbFd, 0, WALINDEX_PGSZ, 0, &pDummy);
  assert( rc!=SQLITE_OK ); /* SQLITE_OK not possible for read-only connection */
  if( rc!=SQLITE_READONLY_CANTINIT ){
    rc = (rc==SQLITE_READONLY ? WAL_RETRY : rc);
    goto begin_unreliable_shm_out;
  }

  /* We reach this point only if the real shared-memory is still unreliable.
  ** Assume the in-memory WAL-index substitute is correct and load it
  ** into pWal->hdr.
  */
  memcpy(&pWal->hdr, (void*)walIndexHdr(pWal), sizeof(WalIndexHdr));

  /* Make sure some writer hasn't come in and changed the WAL file out
  ** from under us, then disconnected, while we were not looking.
  */
  rc = sqlite3OsFileSize(pWal->pWalFd, &szWal);
  if( rc!=SQLITE_OK ){
    goto begin_unreliable_shm_out;
  }
  if( szWal<WAL_HDRSIZE ){
    /* If the wal file is too small to contain a wal-header and the
    ** wal-index header has mxFrame==0, then it must be safe to proceed
    ** reading the database file only. However, the page cache cannot
    ** be trusted, as a read/write connection may have connected, written
    ** the db, run a checkpoint, truncated the wal file and disconnected
    ** since this client's last read transaction.  */
    *pChanged = 1;
    rc = (pWal->hdr.mxFrame==0 ? SQLITE_OK : WAL_RETRY);
    goto begin_unreliable_shm_out;
  }

  /* Check the salt keys at the start of the wal file still match. */
  rc = sqlite3OsRead(pWal->pWalFd, aBuf, WAL_HDRSIZE, 0);
  if( rc!=SQLITE_OK ){
    goto begin_unreliable_shm_out;
  }
  if( memcmp(&pWal->hdr.aSalt, &aBuf[16], 8) ){
    /* Some writer has wrapped the WAL file while we were not looking.
    ** Return WAL_RETRY which will cause the in-memory WAL-index to be
    ** rebuilt. */
    rc = WAL_RETRY;
    goto begin_unreliable_shm_out;
  }

  /* Allocate a buffer to read frames into */
  szFrame = pWal->hdr.szPage + WAL_FRAME_HDRSIZE;
  aFrame = (u8 *)sqlite3_malloc64(szFrame);
  if( aFrame==0 ){
    rc = SQLITE_NOMEM_BKPT;
    goto begin_unreliable_shm_out;
  }
  aData = &aFrame[WAL_FRAME_HDRSIZE];

  /* Check to see if a complete transaction has been appended to the
  ** wal file since the heap-memory wal-index was created. If so, the
  ** heap-memory wal-index is discarded and WAL_RETRY returned to
  ** the caller.  */
  aSaveCksum[0] = pWal->hdr.aFrameCksum[0];
  aSaveCksum[1] = pWal->hdr.aFrameCksum[1];
  for(iOffset=walFrameOffset(pWal->hdr.mxFrame+1, pWal->hdr.szPage); 
      iOffset+szFrame<=szWal; 
      iOffset+=szFrame
  ){
    u32 pgno;                   /* Database page number for frame */
    u32 nTruncate;              /* dbsize field from frame header */

    /* Read and decode the next log frame. */
    rc = sqlite3OsRead(pWal->pWalFd, aFrame, szFrame, iOffset);
    if( rc!=SQLITE_OK ) break;
    if( !walDecodeFrame(pWal, &pgno, &nTruncate, aData, aFrame) ) break;

    /* If nTruncate is non-zero, then a complete transaction has been
    ** appended to this wal file. Set rc to WAL_RETRY and break out of
    ** the loop.  */
    if( nTruncate ){
      rc = WAL_RETRY;
      break;
    }
  }
  pWal->hdr.aFrameCksum[0] = aSaveCksum[0];
  pWal->hdr.aFrameCksum[1] = aSaveCksum[1];

 begin_unreliable_shm_out:
  sqlite3_free(aFrame);
  if( rc!=SQLITE_OK ){
    int i;
    for(i=0; i<pWal->nWiData; i++){
      sqlite3_free((void*)pWal->apWiData[i]);
      pWal->apWiData[i] = 0;
    }
    pWal->bShmUnreliable = 0;
    sqlite3WalEndReadTransaction(pWal);
    *pChanged = 1;
  }
  return rc;
}